

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

base_learner * recall_tree_setup(options_i *options,vw *all)

{
  _Head_base<0UL,_recall_tree_ns::recall_tree_*,_false> _Var1;
  int iVar2;
  uint uVar3;
  option_group_definition *poVar4;
  typed_option<float> *op;
  ulong uVar5;
  ostream *poVar6;
  base_learner *l;
  single_learner *base;
  learner<recall_tree_ns::recall_tree,_example> *plVar7;
  char *pcVar8;
  __type_conflict _Var9;
  double dVar10;
  free_ptr<recall_tree_ns::recall_tree> tree;
  option_group_definition new_options;
  free_ptr<recall_tree_ns::recall_tree> local_5e0;
  allocator local_5cc;
  allocator local_5cb;
  allocator local_5ca;
  allocator local_5c9;
  allocator local_5c8;
  allocator local_5c7;
  allocator local_5c6;
  allocator local_5c5;
  allocator local_5c4;
  allocator local_5c3;
  allocator local_5c2;
  allocator local_5c1;
  string local_5c0 [32];
  string local_5a0;
  string local_580 [32];
  string local_560;
  string local_540 [32];
  string local_520;
  string local_500 [32];
  string local_4e0;
  string local_4c0 [32];
  string local_4a0;
  string local_480 [32];
  string local_460;
  string local_440;
  undefined1 local_420 [112];
  bool local_3b0;
  option_group_definition local_380;
  undefined1 local_348 [112];
  bool local_2d8;
  undefined1 local_2a8 [112];
  bool local_238;
  undefined1 local_208 [112];
  bool local_198;
  undefined1 local_168 [112];
  bool local_f8;
  typed_option<float> local_c8;
  
  scoped_calloc_or_throw<recall_tree_ns::recall_tree>();
  std::__cxx11::string::string((string *)&local_440,"Recall Tree",(allocator *)local_420);
  VW::config::option_group_definition::option_group_definition(&local_380,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string((string *)&local_460,"recall_tree",&local_5c1);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_420,&local_460,
             &(local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->k);
  local_3b0 = true;
  std::__cxx11::string::string(local_480,"Use online tree for multiclass",&local_5c2);
  std::__cxx11::string::_M_assign((string *)(local_420 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_380,(typed_option<unsigned_int> *)local_420);
  std::__cxx11::string::string((string *)&local_4a0,"max_candidates",&local_5c3);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_348,&local_4a0,
             &(local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
              max_candidates);
  local_2d8 = true;
  std::__cxx11::string::string(local_4c0,"maximum number of labels per leaf in the tree",&local_5c4)
  ;
  std::__cxx11::string::_M_assign((string *)(local_348 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_348);
  std::__cxx11::string::string((string *)&local_4e0,"bern_hyper",&local_5c5);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_4e0,
             &(local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->bern_hyper
            );
  op = VW::config::typed_option<float>::default_value(&local_c8,1.0);
  std::__cxx11::string::string(local_500,"recall tree depth penalty",&local_5c6);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,op);
  std::__cxx11::string::string((string *)&local_520,"max_depth",&local_5c7);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_168,&local_520,
             &(local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_depth)
  ;
  local_f8 = true;
  std::__cxx11::string::string
            (local_540,"maximum depth of the tree, default log_2 (#classes)",&local_5c8);
  std::__cxx11::string::_M_assign((string *)(local_168 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_168);
  std::__cxx11::string::string((string *)&local_560,"node_only",&local_5c9);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_208,&local_560,
             &(local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->node_only)
  ;
  local_198 = true;
  std::__cxx11::string::string
            (local_580,"only use node features, not full path features",&local_5ca);
  std::__cxx11::string::_M_assign((string *)(local_208 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_208);
  std::__cxx11::string::string((string *)&local_5a0,"randomized_routing",&local_5cb);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a8,&local_5a0,
             &(local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
              randomized_routing);
  local_238 = true;
  std::__cxx11::string::string(local_5c0,"randomized routing",&local_5cc);
  std::__cxx11::string::_M_assign((string *)(local_2a8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar4,(typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string(local_5c0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string(local_580);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_208);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string(local_540);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_168);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string(local_500);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string(local_4c0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_348);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string(local_480);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_420);
  std::__cxx11::string::~string((string *)&local_460);
  (**options->_vptr_options_i)(options,&local_380);
  std::__cxx11::string::string((string *)local_420,"recall_tree",(allocator *)local_348);
  iVar2 = (*options->_vptr_options_i[1])(options,local_420);
  std::__cxx11::string::~string((string *)local_420);
  if ((char)iVar2 == '\0') {
    plVar7 = (learner<recall_tree_ns::recall_tree,_example> *)0x0;
  }
  else {
    (local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->all = all;
    std::__cxx11::string::string((string *)local_420,"max_candidates",(allocator *)local_348);
    iVar2 = (*options->_vptr_options_i[1])(options,local_420);
    _Var1._M_head_impl =
         local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl;
    if ((char)iVar2 == '\0') {
      _Var9 = std::log<unsigned_int>
                        ((local_5e0._M_t.
                          super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)
                         ->k);
      dVar10 = ceil(_Var9 / 0.6931471805599453);
      uVar3 = (int)(long)dVar10 << 2;
      if ((_Var1._M_head_impl)->k <= uVar3) {
        uVar3 = (_Var1._M_head_impl)->k;
      }
      uVar5 = (ulong)uVar3;
    }
    else {
      uVar5 = (local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
              max_candidates;
    }
    (local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_candidates =
         uVar5;
    std::__cxx11::string::~string((string *)local_420);
    std::__cxx11::string::string((string *)local_420,"max_depth",(allocator *)local_348);
    iVar2 = (*options->_vptr_options_i[1])(options,local_420);
    if ((char)iVar2 == '\0') {
      _Var9 = std::log<unsigned_int>
                        ((local_5e0._M_t.
                          super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)
                         ->k);
      dVar10 = ceil(_Var9 / 0.6931471805599453);
      uVar5 = (long)dVar10 & 0xffffffff;
    }
    else {
      uVar5 = (local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_depth;
    }
    (local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_depth = uVar5;
    std::__cxx11::string::~string((string *)local_420);
    recall_tree_ns::init_tree
              (local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl);
    if (all->quiet == false) {
      poVar6 = std::operator<<(&(all->trace_message).super_ostream,"recall_tree:");
      poVar6 = std::operator<<(poVar6," node_only = ");
      poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
      poVar6 = std::operator<<(poVar6," bern_hyper = ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(local_5e0._M_t.
                                  super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>
                                  .super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>.
                                 _M_head_impl)->bern_hyper);
      poVar6 = std::operator<<(poVar6," max_depth = ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," routing = ");
      if (all->training == true) {
        pcVar8 = "deterministic";
        if ((local_5e0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
             _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
            randomized_routing != false) {
          pcVar8 = "randomized";
        }
      }
      else {
        pcVar8 = "n/a testonly";
      }
      poVar6 = std::operator<<(poVar6,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar7 = LEARNER::
             init_multiclass_learner<recall_tree_ns::recall_tree,example,LEARNER::learner<char,example>>
                       (&local_5e0,base,recall_tree_ns::learn,recall_tree_ns::predict,all->p,
                        (ulong)(local_5e0._M_t.
                                super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>
                                ._M_t.
                                super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>
                                .super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>.
                               _M_head_impl)->k +
                        (local_5e0._M_t.
                         super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
                        max_routers,multiclass);
    *(code **)(plVar7 + 0x80) = recall_tree_ns::save_load_tree;
    *(undefined8 *)(plVar7 + 0x70) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0x78) = *(undefined8 *)(plVar7 + 0x20);
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = recall_tree_ns::finish;
  }
  VW::config::option_group_definition::~option_group_definition(&local_380);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::~unique_ptr(&local_5e0);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* recall_tree_setup(options_i& options, vw& all)
{
  auto tree = scoped_calloc_or_throw<recall_tree>();
  option_group_definition new_options("Recall Tree");
  new_options.add(make_option("recall_tree", tree->k).keep().help("Use online tree for multiclass"))
      .add(make_option("max_candidates", tree->max_candidates)
               .keep()
               .help("maximum number of labels per leaf in the tree"))
      .add(make_option("bern_hyper", tree->bern_hyper).default_value(1.f).help("recall tree depth penalty"))
      .add(make_option("max_depth", tree->max_depth).keep().help("maximum depth of the tree, default log_2 (#classes)"))
      .add(make_option("node_only", tree->node_only).keep().help("only use node features, not full path features"))
      .add(make_option("randomized_routing", tree->randomized_routing).keep().help("randomized routing"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("recall_tree"))
    return nullptr;

  tree->all = &all;
  tree->max_candidates = options.was_supplied("max_candidates")
      ? tree->max_candidates
      : (std::min)(tree->k, 4 * (uint32_t)(ceil(log(tree->k) / log(2.0))));
  tree->max_depth =
      options.was_supplied("max_depth") ? tree->max_depth : (uint32_t)std::ceil(std::log(tree->k) / std::log(2.0));

  init_tree(*tree.get());

  if (!all.quiet)
    all.trace_message << "recall_tree:"
                      << " node_only = " << tree->node_only << " bern_hyper = " << tree->bern_hyper
                      << " max_depth = " << tree->max_depth << " routing = "
                      << (all.training ? (tree->randomized_routing ? "randomized" : "deterministic") : "n/a testonly")
                      << std::endl;

  learner<recall_tree, example>& l = init_multiclass_learner(
      tree, as_singleline(setup_base(options, all)), learn, predict, all.p, tree->max_routers + tree->k);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}